

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_layout_row_template_begin(nk_context *ctx,float height)

{
  nk_window *win;
  nk_panel *pnVar1;
  
  if (((ctx != (nk_context *)0x0) && (win = ctx->current, win != (nk_window *)0x0)) &&
     (pnVar1 = win->layout, pnVar1 != (nk_panel *)0x0)) {
    nk_panel_layout(ctx,win,height,1);
    (pnVar1->row).type = NK_LAYOUT_TEMPLATE;
    (pnVar1->row).columns = 0;
    (pnVar1->row).ratio = (float *)0x0;
    (pnVar1->row).item_width = 0.0;
    (pnVar1->row).item_height = 0.0;
    (pnVar1->row).item_offset = 0.0;
    (pnVar1->row).filled = 0.0;
    (pnVar1->row).item.x = 0.0;
    (pnVar1->row).item.y = 0.0;
    (pnVar1->row).item.w = 0.0;
    (pnVar1->row).item.h = 0.0;
  }
  return;
}

Assistant:

NK_API void
nk_layout_row_template_begin(struct nk_context *ctx, float height)
{
struct nk_window *win;
struct nk_panel *layout;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return;

win = ctx->current;
layout = win->layout;
nk_panel_layout(ctx, win, height, 1);
layout->row.type = NK_LAYOUT_TEMPLATE;
layout->row.columns = 0;
layout->row.ratio = 0;
layout->row.item_width = 0;
layout->row.item_height = 0;
layout->row.item_offset = 0;
layout->row.filled = 0;
layout->row.item.x = 0;
layout->row.item.y = 0;
layout->row.item.w = 0;
layout->row.item.h = 0;
}